

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

bool __thiscall SplineSolver<5U,_2U>::build_solver(SplineSolver<5U,_2U> *this,int N,int M)

{
  SparseMatrix<double,_0,_int> *dst;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_00;
  long row;
  ComputationInfo CVar1;
  Index IVar2;
  Index IVar3;
  StorageIndex *pSVar4;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  StorageIndex *pSVar7;
  Index IVar8;
  Index IVar9;
  SplineSolver<5U,_2U> *pSVar10;
  Scalar *pSVar11;
  size_t __n;
  long lVar12;
  long lVar13;
  ActualDstType actualDst;
  ulong row_00;
  SparseMatrix<double,_0,_int> local_90;
  SplineSolver<5U,_2U> *local_48;
  ulong local_40;
  long local_38;
  
  lVar12 = (long)M;
  local_90._0_8_ = local_90._0_8_ & 0xffffffffffffff00;
  local_90.m_outerSize = 0;
  local_90.m_innerSize = 0;
  local_90.m_outerIndex = (StorageIndex *)0x0;
  local_90.m_innerNonZeros = (StorageIndex *)0x0;
  local_90.m_data.m_values = (Scalar *)0x0;
  local_90.m_data.m_indices = (StorageIndex *)0x0;
  local_90.m_data.m_size = 0;
  local_90.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&local_90,lVar12,lVar12);
  dst = &this->A;
  if (local_90.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
      super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue == true) {
    IVar2 = (this->A).m_outerSize;
    IVar3 = (this->A).m_innerSize;
    (this->A).m_outerSize = local_90.m_outerSize;
    (this->A).m_innerSize = local_90.m_innerSize;
    pSVar4 = (this->A).m_outerIndex;
    pSVar5 = (this->A).m_innerNonZeros;
    (this->A).m_outerIndex = local_90.m_outerIndex;
    (this->A).m_innerNonZeros = local_90.m_innerNonZeros;
    pSVar6 = (this->A).m_data.m_values;
    pSVar7 = (this->A).m_data.m_indices;
    (this->A).m_data.m_values = local_90.m_data.m_values;
    (this->A).m_data.m_indices = local_90.m_data.m_indices;
    IVar8 = (this->A).m_data.m_size;
    IVar9 = (this->A).m_data.m_allocatedSize;
    (this->A).m_data.m_size = local_90.m_data.m_size;
    (this->A).m_data.m_allocatedSize = local_90.m_data.m_allocatedSize;
    local_90.m_outerSize = IVar2;
    local_90.m_innerSize = IVar3;
    local_90.m_outerIndex = pSVar4;
    local_90.m_innerNonZeros = pSVar5;
    local_90.m_data.m_values = pSVar6;
    local_90.m_data.m_indices = pSVar7;
    local_90.m_data.m_size = IVar8;
    local_90.m_data.m_allocatedSize = IVar9;
  }
  else if (dst != &local_90) {
    Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
              ((SparseMatrix<double,0,int> *)dst,&local_90);
    if (local_90.m_innerNonZeros == (StorageIndex *)0x0) {
      __n = (this->A).m_outerSize * 4 + 4;
      if (__n != 0) {
        memcpy((this->A).m_outerIndex,local_90.m_outerIndex,__n);
      }
      Eigen::internal::CompressedStorage<double,_int>::operator=(&(this->A).m_data,&local_90.m_data)
      ;
    }
    else {
      Eigen::internal::
      assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                (dst,&local_90);
    }
  }
  local_48 = this;
  free(local_90.m_outerIndex);
  free(local_90.m_innerNonZeros);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_90.m_data);
  local_90.m_outerSize = CONCAT44(6,(undefined4)local_90.m_outerSize);
  local_90._0_8_ = lVar12;
  if (M < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  Eigen::SparseMatrix<double,0,int>::
  reserveInnerVectors<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((SparseMatrix<double,0,int> *)dst,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
              *)&local_90);
  if (2 < N) {
    local_40 = (ulong)(N - 2U);
    lVar12 = (long)(int)(N - 2U);
    local_38 = (long)(N + -3);
    row_00 = 0;
    do {
      pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row_00,row_00);
      *pSVar11 = 16.0;
      row = lVar12 + row_00;
      pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,row_00);
      *pSVar11 = 0.0;
      pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row_00,row);
      *pSVar11 = 0.0;
      pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,row);
      *pSVar11 = -6.0;
      if (row_00 != 0) {
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row_00,row_00 - 1);
        *pSVar11 = 7.0;
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,row_00 - 1);
        *pSVar11 = 8.0;
        lVar13 = row_00 + lVar12 + -1;
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row_00,lVar13);
        *pSVar11 = 1.0;
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,lVar13);
        *pSVar11 = 1.0;
      }
      if ((long)row_00 < local_38) {
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row_00,row_00 + 1);
        *pSVar11 = 7.0;
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,row_00 + 1);
        *pSVar11 = -8.0;
        lVar13 = row_00 + lVar12 + 1;
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row_00,lVar13);
        *pSVar11 = -1.0;
        pSVar11 = Eigen::SparseMatrix<double,_0,_int>::insert(dst,row,lVar13);
        *pSVar11 = 1.0;
      }
      row_00 = row_00 + 1;
    } while (local_40 != row_00);
  }
  Eigen::SparseMatrix<double,_0,_int>::makeCompressed(dst);
  pSVar10 = local_48;
  this_00 = &local_48->solver;
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            (this_00,dst);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            (this_00,dst);
  if ((pSVar10->solver).
      super_SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>_>
      .m_isInitialized != false) {
    CVar1 = (pSVar10->solver).m_info;
    if (CVar1 != Success) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inverse failed",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
    }
    return CVar1 == Success;
  }
  __assert_fail("m_isInitialized && \"Decomposition is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/SparseLU/SparseLU.h",0x12d,
                "ComputationInfo Eigen::SparseLU<Eigen::SparseMatrix<double>, Eigen::COLAMDOrdering<int>>::info() const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>]"
               );
}

Assistant:

bool SplineSolver<5, Dims>::build_solver(const int N, const int M)
{
    A = SparseMatrix<double>(M, M);
    A.reserve(VectorXi::Constant(M, 6));

    for (int k = 0; k<N-2; ++k)
    {
        A.insert(k, k) = 16;
        A.insert(N-2+k, k) = 0;
        A.insert(k, N-2+k) = 0;
        A.insert(N-2+k, N-2+k) = -6;

        if (k > 0)
        {
            A.insert(k, k-1) = 7;
            A.insert(N-2+k, k-1) = 8;
            A.insert(k, N-2+k-1) = 1;
            A.insert(N-2+k, N-2+k-1) = 1;
        }

        if (k < N-3)
        {
            A.insert(k, k+1) = 7;
            A.insert(N-2+k, k+1) = -8;
            A.insert(k, N-2+k+1) = -1;
            A.insert(N-2+k, N-2+k+1) = 1;
        }
    }

    A.makeCompressed();
    solver.compute(A);

    if (solver.info() != Success)
    {
        cout << "inverse failed" << endl;
        return false;
    }

    return true;
}